

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O2

void SPARSITY_INFO(int *nJdata,int *consP,int NCELLS)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  int i;
  double *pdVar27;
  double *pdVar28;
  int k_2;
  int iVar29;
  long lVar30;
  int n;
  long lVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined4 uVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  GpuArray<double,_9U> conc;
  Real h_RT [9];
  GpuArray<double,_100U> Jac;
  Real c_R [9];
  Real dcRdT [9];
  double local_768;
  double dStack_720;
  double dStack_710;
  double local_6f8 [4];
  undefined1 local_6d8 [16];
  undefined1 auStack_6c8 [16];
  double dStack_6b8;
  double local_6a8 [2];
  undefined4 local_698;
  undefined4 uStack_694;
  double dStack_690;
  double local_688;
  double local_680;
  double dStack_678;
  double local_670;
  double local_658 [10];
  double local_608;
  undefined8 uStack_600;
  double local_5f8;
  undefined8 uStack_5f0;
  double local_5e8;
  double local_5d8;
  double local_5c8;
  double local_5b8;
  double dStack_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  undefined8 local_568;
  double local_558 [73];
  undefined1 local_310 [16];
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_288 [10];
  double local_238;
  undefined8 uStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  undefined8 uStack_210;
  double local_208;
  double dStack_200;
  undefined1 local_1f8 [16];
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  undefined8 uStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128 [10];
  double local_d8 [10];
  undefined1 local_88 [16];
  double local_78 [9];
  
  pdVar28 = local_558;
  memset(pdVar28,0,800);
  local_658[6] = 0.0;
  local_658[7] = 0.0;
  local_658[4] = 0.0;
  local_658[5] = 0.0;
  local_658[2] = 0.0;
  local_658[3] = 0.0;
  local_658[0] = 0.0;
  local_658[1] = 0.0;
  local_658[8] = 0.0;
  for (lVar31 = 0; dVar63 = local_658[2], lVar31 != 9; lVar31 = lVar31 + 1) {
    local_658[lVar31] = 0.1111111111111111;
  }
  iVar29 = *consP;
  for (lVar31 = 0; lVar31 != 100; lVar31 = lVar31 + 1) {
    local_558[lVar31] = 0.0;
  }
  for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
    local_6a8[lVar31] = 0.0;
  }
  dVar59 = 0.0;
  for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
    dVar59 = dVar59 + local_658[lVar31];
  }
  local_5a8 = 2.911342024497792;
  dStack_5a0 = 3.254512984911126;
  local_598 = -15.528347679998124;
  dStack_590 = 19.481084666666668;
  local_588 = 22.009669090999374;
  dStack_580 = 5.94295186894925;
  local_578 = 5.3818731557687505;
  dStack_570 = -5.101694818407498;
  local_568 = 0x4008a2a8a3a0d57d;
  local_5f8 = local_658[0];
  uStack_5f0 = 0;
  dVar33 = local_658[2] * 10.0 + local_658[1] * -0.21999999999999997 + dVar59 + local_658[0];
  local_608 = local_658[3];
  uStack_600 = 0;
  local_5e8 = local_658[1];
  dVar42 = local_658[1] * local_658[3];
  dVar52 = ((dVar33 * 1e-12) / 118698922.25997423) * 1838773899538452.5;
  local_1f8._0_8_ = dVar52 + 1.0;
  dVar32 = dVar52 / (double)local_1f8._0_8_;
  dVar50 = -0.0006207345732258481 / (double)local_1f8._0_8_;
  dVar52 = log10(dVar52);
  local_5b8 = exp(-1.5e+33);
  local_5b8 = local_5b8 * 0.19999999999999996;
  local_208 = local_5b8 + 0.8;
  local_5d8 = log10(local_208);
  local_5c8 = local_5d8 * -1.27 + 0.75;
  dVar52 = local_5d8 * -0.67 + -0.4 + dVar52;
  dVar43 = 1.0 / (dVar52 * -0.14 + local_5c8);
  dVar52 = dVar52 * dVar43;
  local_218 = 1.0 / (dVar52 * dVar52 + 1.0);
  dVar40 = pow(10.0,local_5d8 * local_218);
  dVar51 = local_658[7];
  dVar49 = (local_5d8 + local_5d8) * local_218 * local_218 * dVar52 * dVar43;
  dVar43 = -local_5c8 * dVar49 * dVar43;
  dVar40 = dVar40 * dVar32;
  dVar44 = (dVar42 * 118698922.25997423 + local_658[6] * -11503468.582662737) * dVar40;
  dVar32 = (dVar42 * 47479.56890398969 + local_658[6] * -130017.75806443932) * dVar40 +
           (dVar43 * -0.0006207345732258481 +
            (dVar49 * dVar52 * -1.27 + dVar43 * -0.67 + local_218) *
            (local_5b8 / -1e-30 + -8e-31) * (0.43429448190325176 / local_208) + dVar50) *
           2.302585092994046 * dVar44;
  dVar52 = local_6a8[1] - dVar44;
  local_6a8[1] = dVar52;
  dVar50 = dStack_690 - dVar44;
  dStack_690 = dVar50;
  dStack_678 = dStack_678 + dVar44;
  dVar49 = dVar40 * 118698922.25997423;
  dVar40 = dVar40 * 11503468.582662737;
  dVar33 = (1.0 / (double)local_1f8._0_8_ + dVar43) * (dVar44 / dVar33);
  if (iVar29 == 0) {
    local_6f8[0] = dVar33 + dVar33;
    local_6f8[1] = dVar33 * 0.78 + dVar49 * local_608;
    local_6f8[2] = dVar33 * 11.0;
    local_6f8[3] = dVar49 * local_5e8 + dVar33;
    local_6d8._8_8_ = dVar33;
    local_6d8._0_8_ = dVar33;
    auStack_6c8._8_8_ = dVar33;
    auStack_6c8._0_8_ = dVar33 - dVar40;
    dStack_6b8 = dVar33;
    pdVar27 = local_558 + 1;
    for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
      dVar40 = local_6f8[lVar31];
      *pdVar27 = *pdVar27 - dVar40;
      pdVar27[2] = pdVar27[2] - dVar40;
      pdVar27[5] = dVar40 + pdVar27[5];
      pdVar27 = pdVar27 + 10;
    }
  }
  else {
    local_558[1] = local_558[1] - dVar33;
    local_558[3] = local_558[3] - dVar33;
    local_558[6] = local_558[6] + dVar33;
    dVar43 = dVar33 * -0.21999999999999997 + dVar49 * local_608;
    local_558[0xb] = local_558[0xb] - dVar43;
    local_558[0xd] = local_558[0xd] - dVar43;
    local_558[0x10] = dVar43 + local_558[0x10];
    dVar33 = dVar33 * 10.0;
    local_558[0x15] = local_558[0x15] - dVar33;
    local_558[0x17] = local_558[0x17] - dVar33;
    local_558[0x1a] = dVar33 + local_558[0x1a];
    dVar49 = dVar49 * local_5e8;
    local_558[0x1f] = local_558[0x1f] - dVar49;
    local_558[0x21] = local_558[0x21] - dVar49;
    local_558[0x24] = dVar49 + local_558[0x24];
    local_558[0x3d] = local_558[0x3d] + dVar40;
    local_558[0x3f] = local_558[0x3f] + dVar40;
    local_558[0x42] = local_558[0x42] - dVar40;
  }
  dVar40 = local_288[1] - dVar32;
  local_288[1] = dVar40;
  local_288[3] = local_288[3] - dVar32;
  local_288[6] = dVar32 + local_288[6];
  local_1f8._0_8_ = dVar63 * 11.0 + local_5f8 * 1.5 + dVar59;
  local_1f8._8_8_ = 0;
  local_5b8 = (((double)local_1f8._0_8_ * 1e-06) / 25936106.98548031) * 28231227327.532616;
  local_238 = local_288[3];
  dVar59 = log10(local_5b8);
  local_208 = exp(-1.5e+33);
  local_208 = local_208 * 0.5;
  local_5c8 = local_208 + 0.5;
  local_228 = log10(local_5c8);
  dVar33 = local_228 * -1.27 + 0.75;
  dVar59 = local_228 * -0.67 + -0.4 + dVar59;
  dVar32 = 1.0 / (dVar59 * -0.14 + dVar33);
  local_218 = dVar59 * dVar32;
  local_5d8 = 1.0 / (local_218 * local_218 + 1.0);
  dVar59 = pow(10.0,local_228 * local_5d8);
  dVar44 = (local_228 + local_228) * local_5d8 * local_5d8 * local_218 * dVar32;
  dVar32 = -dVar33 * dVar44 * dVar32;
  dVar43 = local_5b8 + 1.0;
  dVar59 = (local_5b8 / dVar43) * dVar59;
  dVar33 = (dVar51 * 25936106.98548031 + local_658[5] * local_658[5] * -3419315.29664768) * dVar59;
  dVar51 = (dVar51 * 280925.8837546357 + local_658[5] * local_658[5] * -591.7471466541167) * dVar59
           + (dVar32 * -0.0002845931413337665 +
              (dVar44 * local_218 * -1.27 + dVar32 * -0.67 + local_5d8) *
              (local_208 / -1e-30 + -4.9999999999999995e-31) * (0.43429448190325176 / local_5c8) +
             -0.0002845931413337665 / dVar43) * 2.302585092994046 * dVar33;
  local_680 = dVar33 + dVar33 + local_680;
  local_670 = local_670 - dVar33;
  local_6f8[1] = (1.0 / dVar43 + dVar32) * (dVar33 / (double)local_1f8._0_8_);
  dVar33 = dVar59 * 25936106.98548031;
  if (iVar29 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5;
    local_6f8[2] = local_6f8[1] * 12.0;
    local_6f8[3] = local_6f8[1];
    local_6d8._8_8_ = dVar59 * 3419315.29664768 * -2.0 * local_658[5] + local_6f8[1];
    local_6d8._0_8_ = local_6f8[1];
    auStack_6c8._8_8_ = dVar33 + local_6f8[1];
    auStack_6c8._0_8_ = local_6f8[1];
    dStack_6b8 = local_6f8[1];
    pdVar27 = local_558 + 7;
    for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
      dVar59 = local_6f8[lVar31];
      pdVar27[-2] = dVar59 + dVar59 + pdVar27[-2];
      *pdVar27 = *pdVar27 - dVar59;
      pdVar27 = pdVar27 + 10;
    }
  }
  else {
    dVar32 = local_6f8[1] * 1.5;
    local_558[5] = dVar32 + dVar32 + local_558[5];
    local_558[7] = local_558[7] - dVar32;
    local_6f8[1] = local_6f8[1] * 11.0;
    local_558[0x19] = local_6f8[1] + local_6f8[1] + local_558[0x19];
    local_558[0x1b] = local_558[0x1b] - local_6f8[1];
    dVar59 = dVar59 * 3419315.29664768 * -2.0 * local_658[5];
    local_558[0x37] = dVar59 + dVar59 + local_558[0x37];
    local_558[0x39] = local_558[0x39] - dVar59;
    local_300 = dVar33 + dVar33 + local_300;
    local_2f0 = local_2f0 - dVar33;
  }
  local_288[5] = dVar51 + dVar51 + local_288[5];
  local_288[7] = local_288[7] - dVar51;
  local_6f8[1] = local_5f8 * 1.0145869685785861e-06 + local_608 * local_608 * -407.1662961015109;
  dVar33 = (double)local_1f8._0_8_ * local_6f8[1];
  dVar59 = (local_5f8 * 2.2738361995042403e-08 + local_608 * local_608 * 0.38915785318430907) *
           (double)local_1f8._0_8_;
  local_6a8[0] = local_6a8[0] - dVar33;
  dStack_690 = dVar33 + dVar33 + dVar50;
  if (iVar29 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5 + (double)local_1f8._0_8_ * 1.0145869685785861e-06;
    local_6f8[2] = local_6f8[1] * 12.0;
    local_6f8[3] = (double)local_1f8._0_8_ * 407.1662961015109 * -2.0 * local_608 + local_6f8[1];
    uVar41 = (undefined4)((ulong)local_6f8[1] >> 0x20);
    auStack_6c8._8_4_ = SUB84(local_6f8[1],0);
    auStack_6c8._0_8_ = local_6f8[1];
    auStack_6c8._12_4_ = uVar41;
    local_6d8._8_4_ = SUB84(local_6f8[1],0);
    local_6d8._0_8_ = local_6f8[1];
    local_6d8._12_4_ = uVar41;
    dStack_6b8 = local_6f8[1];
    pdVar27 = local_558;
    for (lVar31 = 0; local_238 = local_288[3], lVar31 != 9; lVar31 = lVar31 + 1) {
      dVar33 = local_6f8[lVar31];
      *pdVar27 = *pdVar27 - dVar33;
      pdVar27[3] = dVar33 + dVar33 + pdVar27[3];
      pdVar27 = pdVar27 + 10;
    }
  }
  else {
    dVar33 = local_6f8[1] * 1.5 + (double)local_1f8._0_8_ * 1.0145869685785861e-06;
    local_558[0] = local_558[0] - dVar33;
    local_558[3] = dVar33 + dVar33 + local_558[3];
    local_6f8[1] = local_6f8[1] * 11.0;
    local_558[0x14] = local_558[0x14] - local_6f8[1];
    local_558[0x17] = local_6f8[1] + local_6f8[1] + local_558[0x17];
    dVar33 = (double)local_1f8._0_8_ * 407.1662961015109 * -2.0 * local_608;
    local_558[0x1e] = local_558[0x1e] - dVar33;
    local_558[0x21] = dVar33 + dVar33 + local_558[0x21];
  }
  local_288[0] = local_288[0] - dVar59;
  local_288[3] = dVar59 + dVar59 + local_238;
  local_6f8[3] = local_658[4] * local_658[4] * 159.17961552912485 +
                 local_5e8 * -2.0846475553480232e-08;
  dVar59 = (double)local_1f8._0_8_ * local_6f8[3];
  dVar33 = (local_658[4] * local_658[4] * -0.05305987184304161 + local_5e8 * -5.456888123885079e-10)
           * (double)local_1f8._0_8_;
  local_6a8[1] = dVar52 + dVar59;
  dVar32 = (double)local_1f8._0_8_ * 159.17961552912485;
  dVar52 = (double)local_1f8._0_8_ * 2.0846475553480232e-08;
  if (iVar29 == 0) {
    local_6f8[0] = local_6f8[3] * 2.5;
    local_6f8[1] = local_6f8[3] - dVar52;
    local_6f8[2] = local_6f8[3] * 12.0;
    dStack_6b8 = local_6f8[3];
    local_6d8._8_8_ = local_6f8[3];
    local_6d8._0_8_ = (dVar32 + dVar32) * local_658[4] + local_6f8[3];
    auStack_6c8._8_8_ = local_6f8[3];
    auStack_6c8._0_8_ = local_6f8[3];
    pdVar27 = local_558 + 1;
    for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
      dVar52 = local_6f8[lVar31];
      *pdVar27 = *pdVar27 + dVar52;
      pdVar27[3] = pdVar27[3] - (dVar52 + dVar52);
      pdVar27 = pdVar27 + 10;
    }
    dVar40 = local_288[1];
  }
  else {
    dVar50 = local_6f8[3] * 1.5;
    local_558[1] = local_558[1] + dVar50;
    local_558[4] = local_558[4] - (dVar50 + dVar50);
    local_558[0xb] = local_558[0xb] - dVar52;
    local_558[0xe] = local_558[0xe] - dVar52 * -2.0;
    local_6f8[3] = local_6f8[3] * 11.0;
    local_558[0x15] = local_558[0x15] + local_6f8[3];
    local_558[0x18] = local_558[0x18] - (local_6f8[3] + local_6f8[3]);
    dVar52 = (dVar32 + dVar32) * local_658[4];
    local_558[0x29] = local_558[0x29] + dVar52;
    local_558[0x2c] = local_558[0x2c] - (dVar52 + dVar52);
  }
  local_288[1] = dVar40 + dVar33;
  local_288[4] = local_288[4] - (dVar33 + dVar33);
  local_6f8[1] = local_608 * local_658[4] * 3142.6666666666665 +
                 local_658[5] * -5.646680545093694e-06;
  dVar52 = (double)local_1f8._0_8_ * local_6f8[1];
  dVar32 = (local_608 * local_658[4] * -2.095111111111111 + local_658[5] * -1.262891468371164e-07) *
           (double)local_1f8._0_8_;
  dStack_690 = dStack_690 - dVar52;
  local_688 = (local_688 - (dVar59 + dVar59)) - dVar52;
  local_680 = dVar52 + local_680;
  dVar52 = (double)local_1f8._0_8_ * 3142.6666666666665;
  dVar59 = (double)local_1f8._0_8_ * 5.646680545093694e-06;
  if (iVar29 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5;
    local_6f8[2] = local_6f8[1] * 12.0;
    local_6f8[3] = local_6f8[1] + local_658[4] * dVar52;
    local_6d8._8_8_ = local_6f8[1] - dVar59;
    local_6d8._0_8_ = local_6f8[1] + local_608 * dVar52;
    auStack_6c8._8_8_ = local_6f8[1];
    auStack_6c8._0_8_ = local_6f8[1];
    dStack_6b8 = local_6f8[1];
    pdVar27 = local_558 + 5;
    for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
      dVar59 = local_6f8[lVar31];
      pdVar27[-2] = pdVar27[-2] - dVar59;
      pdVar27[-1] = pdVar27[-1] - dVar59;
      *pdVar27 = dVar59 + *pdVar27;
      pdVar27 = pdVar27 + 10;
    }
  }
  else {
    dVar50 = local_6f8[1] * 1.5;
    local_558[3] = local_558[3] - dVar50;
    local_558[4] = local_558[4] - dVar50;
    local_558[5] = dVar50 + local_558[5];
    local_6f8[1] = local_6f8[1] * 11.0;
    local_558[0x17] = local_558[0x17] - local_6f8[1];
    local_558[0x18] = local_558[0x18] - local_6f8[1];
    local_558[0x19] = local_6f8[1] + local_558[0x19];
    dVar50 = dVar52 * local_658[4];
    local_558[0x21] = local_558[0x21] - dVar50;
    local_558[0x22] = local_558[0x22] - dVar50;
    local_558[0x23] = dVar50 + local_558[0x23];
    dVar52 = dVar52 * local_608;
    local_558[0x2b] = local_558[0x2b] - dVar52;
    local_558[0x2c] = local_558[0x2c] - dVar52;
    local_558[0x2d] = dVar52 + local_558[0x2d];
    local_558[0x35] = dVar59 + local_558[0x35];
    local_558[0x36] = dVar59 + local_558[0x36];
    local_558[0x37] = local_558[0x37] - dVar59;
  }
  local_288[3] = local_288[3] - dVar32;
  dVar43 = local_288[4] - dVar32;
  local_288[4] = dVar43;
  local_288[5] = dVar32 + local_288[5];
  dVar52 = local_608 * local_658[5];
  local_6f8[1] = dVar52 * 16888.888888888887 + dVar63 * -1.4321870058604512e-06;
  dVar59 = (double)local_1f8._0_8_ * local_6f8[1];
  dVar32 = (dVar52 * -22.518518518518515 + dVar63 * -3.623660767668382e-08) *
           (double)local_1f8._0_8_;
  dVar63 = (double)CONCAT44(uStack_694,local_698) + dVar59;
  local_698 = SUB84(dVar63,0);
  uStack_694 = (undefined4)((ulong)dVar63 >> 0x20);
  dVar50 = (double)local_1f8._0_8_ * 16888.888888888887;
  if (iVar29 == 0) {
    local_6f8[0] = local_6f8[1] * 2.5;
    local_6f8[2] = -((double)local_1f8._0_8_ * 1.4321870058604512e-06) + local_6f8[1] * 12.0;
    local_6f8[3] = local_6f8[1] + local_658[5] * dVar50;
    local_6d8._8_8_ = dVar50 * local_608 + local_6f8[1];
    local_6d8._0_8_ = local_6f8[1];
    auStack_6c8._8_8_ = local_6f8[1];
    auStack_6c8._0_8_ = local_6f8[1];
    dStack_6b8 = local_6f8[1];
    pdVar27 = local_558 + 2;
    for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
      dVar50 = local_6f8[lVar31];
      *pdVar27 = *pdVar27 + dVar50;
      pdVar27[1] = pdVar27[1] - dVar50;
      pdVar27[3] = pdVar27[3] - dVar50;
      pdVar27 = pdVar27 + 10;
    }
    local_768 = local_558[0x35];
  }
  else {
    dVar51 = local_6f8[1] * 1.5;
    local_558[3] = local_558[3] - dVar51;
    local_558[2] = local_558[2] + dVar51;
    local_558[5] = local_558[5] - dVar51;
    dVar51 = local_6f8[1] * 11.0 - (double)local_1f8._0_8_ * 1.4321870058604512e-06;
    local_558[0x16] = local_558[0x16] + dVar51;
    local_558[0x17] = local_558[0x17] - dVar51;
    local_558[0x19] = local_558[0x19] - dVar51;
    dVar51 = dVar50 * local_658[5];
    local_558[0x21] = local_558[0x21] - dVar51;
    local_558[0x23] = local_558[0x23] - dVar51;
    dVar50 = dVar50 * local_608;
    local_558[0x34] = local_558[0x34] + dVar50;
    local_768 = local_558[0x35] - dVar50;
    local_558[0x37] = local_558[0x37] - dVar50;
    local_558[0x20] = local_558[0x20] + dVar51;
  }
  dVar77 = dVar42 * 694956.7634748495 + local_658[4] * local_658[5] * -9534710.169227276;
  dVar34 = dVar42 * 2391.8538305613447 + local_658[4] * local_658[5] * 345.9681317415751;
  local_608 = local_608 * 694956.7634748495;
  auVar1._8_4_ = SUB84(local_608 + local_558[0xf],0);
  auVar1._0_8_ = local_608 + local_558[0xe];
  auVar1._12_4_ = (int)((ulong)(local_608 + local_558[0xf]) >> 0x20);
  local_5e8 = local_5e8 * 694956.7634748495;
  dVar64 = local_658[4] * -9534710.169227276;
  dStack_200 = (local_288[3] - dVar32) - dVar34;
  dVar49 = local_658[4] * 1860366.9115799016;
  local_558[4] = local_558[4] - dVar49;
  dVar68 = local_658[5] * -1341454.8115373214;
  local_558[0x22] = (local_558[0x22] + local_5e8) - dVar68;
  dVar78 = local_658[0] * 1860366.9115799016;
  dVar25 = local_658[5] * -9534710.169227276;
  auVar2._8_4_ = SUB84(local_558[0x29] - dVar25,0);
  auVar2._0_8_ = local_558[0x28] - dVar78;
  auVar2._12_4_ = (int)((ulong)(local_558[0x29] - dVar25) >> 0x20);
  local_558[0x2b] = (local_558[0x2b] - dVar25) + dVar78;
  dVar50 = local_658[5] * 4271828.084344627;
  dVar51 = dVar50 + local_558[3] + dVar49;
  auVar3._8_4_ = SUB84(dVar51,0);
  auVar3._0_8_ = dVar50 + local_558[2];
  auVar3._12_4_ = (int)((ulong)dVar51 >> 0x20);
  local_558[5] = (dVar49 + local_558[5]) - dVar50;
  dVar51 = local_658[2] * -145376.75098299314;
  dVar42 = dVar51 + (local_558[0x21] - local_5e8) + dVar68;
  auVar4._8_4_ = SUB84(dVar42,0);
  auVar4._0_8_ = dVar51 + local_558[0x20];
  auVar4._12_4_ = (int)((ulong)dVar42 >> 0x20);
  dVar53 = local_658[3] * -1341454.8115373214;
  dVar42 = local_658[3] * -145376.75098299314;
  dVar14 = local_658[4] * 86324.17110758815;
  local_558[0x14] = local_558[0x14] - dVar42;
  dVar21 = local_658[0] * 4271828.084344627;
  local_558[0x32] = (local_558[0x32] - dVar53) - dVar21;
  local_558[0x18] = local_558[0x18] - dVar14;
  dVar44 = local_658[2] * 86324.17110758815;
  local_558[0x2a] = local_558[0x2a] - dVar44;
  dVar22 = local_658[5] * -3658126.0115307234;
  dVar38 = local_658[3] * local_658[2];
  auVar16._8_4_ = SUB84(dVar52,0);
  auVar16._0_8_ = dVar38;
  auVar16._12_4_ = (int)((ulong)dVar52 >> 0x20);
  dVar23 = local_658[0] * local_658[5] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((dStack_590 + local_598) - (dStack_580 + local_5a8)) * 0.0006666666666666666) *
           -145376.75098299314 * dVar38;
  dVar26 = local_5f8 * local_658[4] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((dStack_580 + dStack_590) - (local_588 + local_5a8)) * 0.0006666666666666666) *
           -1341454.8115373214 * dVar52;
  auVar17._8_4_ = SUB84(dVar26,0);
  auVar17._0_8_ = dVar23;
  auVar17._12_4_ = (int)((ulong)dVar26 >> 0x20);
  dVar35 = local_658[1] * -0.32384379658070717;
  dVar52 = dVar35 + ((local_558[0] - dVar49) - dVar50);
  auVar5._8_4_ = SUB84(dVar35 + local_558[1],0);
  auVar5._0_8_ = dVar52;
  auVar5._12_4_ = (int)((ulong)(dVar35 + local_558[1]) >> 0x20);
  local_558[3] = auVar3._8_8_;
  dVar49 = local_658[6] * 12595057.621245861;
  local_558[0x1f] = dVar49 + (local_558[0x1f] - local_5e8);
  local_558[0x21] = auVar4._8_8_;
  dVar45 = local_658[3] * 12595057.621245861;
  dVar46 = local_658[6] * 64119709.90701692;
  uStack_210 = 0;
  dVar69 = local_658[5] * -0.6025543492746578;
  dVar60 = local_658[5] * -32.62001221218423;
  dVar62 = local_658[1] * -0.6025543492746578;
  local_558[0xf] = auVar1._8_8_;
  dVar58 = local_658[6] * 32500000.0;
  local_558[0x29] = auVar2._8_8_;
  local_558[0x29] = local_558[0x29] + dVar58;
  local_558[0x28] = local_558[0x28] - dVar78;
  local_198 = (((local_558[0x36] + dVar64) - dVar53) - dVar22) - dVar62;
  dVar54 = local_658[3] * 64119709.90701692;
  dVar57 = local_658[4] * 32500000.0;
  dVar72 = local_658[6] * local_658[3];
  dVar36 = dVar72 * 12595057.621245861 + local_658[0] * local_658[1] * -0.32384379658070717;
  dVar37 = dVar72 * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((local_5a8 + dStack_5a0) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -0.32384379658070717 * local_658[0] * local_658[1];
  dVar10 = dVar72 * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((dStack_580 + dStack_580) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -16.310006106092114 * local_658[5] * local_658[5];
  dVar15 = local_658[4] * local_658[6] * 0.0 +
           (0.0 - ((dStack_580 + dStack_5a0) - (local_578 + local_588)) * 0.0006666666666666666) *
           -0.6025543492746578 * local_658[5] * local_658[1];
  auVar6._8_4_ = SUB84(dVar15,0);
  auVar6._0_8_ = dVar10;
  auVar6._12_4_ = (int)((ulong)dVar15 >> 0x20);
  dVar70 = local_658[6] * local_658[5] * 34143562.115192875 +
           local_658[1] * local_658[2] * -0.029876205886692417;
  dVar75 = local_658[6] * local_658[5] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((dStack_5a0 + local_598) - (dStack_580 + local_578)) * 0.0006666666666666666) *
           -0.029876205886692417 * local_658[1] * local_658[2];
  dVar65 = local_658[2] * -0.029876205886692417;
  dVar67 = local_658[0] * -0.32384379658070717;
  local_558[10] = dVar67 + local_558[10];
  local_558[0xc] = local_558[0xc] + dVar65;
  local_558[0xd] = (local_558[0xd] - local_608) - dVar67;
  local_558[0xf] = (local_558[0xf] + dVar69) - dVar65;
  local_558[0xe] = (local_608 + local_558[0xe]) - dVar69;
  dVar15 = local_658[1] * -0.029876205886692417;
  local_558[0x15] = local_558[0x15] + dVar15;
  dVar47 = local_658[6] * 15085094.926858293;
  dVar11 = local_658[6] * 34143562.115192875;
  local_168 = ((local_558[0x38] - dVar60) - dVar62) - dVar11;
  local_558[0x33] = (local_558[0x33] - dVar64) + dVar62 + dVar11;
  dVar24 = local_658[5] * 34143562.115192875;
  dVar55 = local_658[7] * -4.470666408692084;
  local_158 = local_658[0] * local_658[6];
  uStack_150 = 0;
  dVar56 = local_658[6] * -4323.663734083463;
  uVar41 = (undefined4)((ulong)local_658[5] >> 0x20);
  auVar18._8_4_ = SUB84(local_658[5],0);
  auVar18._0_8_ = local_658[0];
  auVar18._12_4_ = uVar41;
  local_88._8_4_ = SUB84(local_658[7],0);
  local_88._0_8_ = local_658[5];
  local_88._12_4_ = (int)((ulong)local_658[7] >> 0x20);
  dVar39 = local_658[7] * -150.1634478502138;
  dVar12 = local_658[1] * -150.1634478502138;
  dVar74 = local_658[7] * local_658[1];
  dVar76 = local_658[6] * local_658[6];
  dVar13 = dVar76 * 20212.492175153773 +
           (0.0026797964842987356 -
           ((dStack_5a0 + dStack_570) - (local_578 + local_578)) * 0.0006666666666666666) *
           -150.1634478502138 * dVar74;
  uStack_180 = 0;
  dVar48 = dVar76 * 7542547.463429146 + dVar74 * -150.1634478502138;
  local_558[0xb] = dVar67 + (local_558[0xb] - local_608) + dVar69 + dVar65 + dVar39 + dVar55;
  local_558[0x10] =
       ((((local_558[0x10] - dVar67) - dVar69) - dVar65) - (dVar39 + dVar39)) - (dVar55 + dVar55);
  local_558[0x11] = dVar55 + dVar39 + local_558[0x11];
  dStack_720 = auVar16._8_8_;
  dVar38 = local_658[0] * local_658[5] * 4271828.084344627 + dVar38 * -145376.75098299314;
  dVar55 = local_5f8 * local_658[4] * 1860366.9115799016 + dStack_720 * -1341454.8115373214;
  dVar39 = local_658[4] * local_658[2] * 374.95779706744673 +
           (0.00434360147634811 -
           (dStack_580 * 2.0 + -(local_588 + local_598)) * 0.0006666666666666666) *
           -1829063.0057653617 * local_658[5] * local_658[5];
  dVar65 = dVar76 * -81.82756742036453 +
           (-0.0003643959615980579 -
           (local_578 * -2.0 + dStack_5a0 + dStack_570) * 0.0006666666666666666) *
           -4.470666408692084 * dVar74;
  dStack_710 = auVar17._8_8_;
  local_1a8._8_8_ = auVar6._8_8_;
  local_218 = dVar65 * -2.0 +
              (((((local_288[6] - dVar37) - dVar10) - (double)local_1a8._8_8_) - dVar75) -
              (dVar13 + dVar13));
  dVar73 = (((dVar43 + dVar34) - dVar26) - dVar39) - (double)local_1a8._8_8_;
  dVar61 = dVar37 + ((dVar40 + dVar33) - dVar34) + (double)local_1a8._8_8_;
  dVar71 = dVar10 + dVar10 + dVar39 * 2.0 + ((dVar26 + dVar34 + (local_288[5] - dVar32)) - dVar23) +
           (double)local_1a8._8_8_;
  dVar43 = dVar72 * 64119709.90701692 + local_658[5] * local_658[5] * -16.310006106092114;
  dStack_220 = local_658[4] * local_658[6] * 32500000.0 +
               local_658[5] * local_658[1] * -0.6025543492746578;
  dVar66 = local_658[4] * local_658[2] * 86324.17110758815 +
           local_658[5] * local_658[5] * -1829063.0057653617;
  dVar76 = dVar76 * 224556.7351007675 + dVar74 * -4.470666408692084;
  dVar40 = dVar38 + ((dStack_690 - dVar59) - dVar77) + dVar55;
  dVar72 = (dVar63 + dVar38) - dVar66;
  auVar19._8_4_ = SUB84(dVar40,0);
  auVar19._0_8_ = dVar72;
  auVar19._12_4_ = (int)((ulong)dVar40 >> 0x20);
  dStack_690 = auVar19._8_8_;
  dVar33 = (dStack_690 - dVar36) - dVar43;
  dVar63 = (((local_688 + dVar77) - dVar55) - dVar66) - dStack_220;
  auVar20._8_4_ = SUB84(dVar63,0);
  auVar20._0_8_ = dVar33;
  auVar20._12_4_ = (int)((ulong)dVar63 >> 0x20);
  local_688 = auVar20._8_8_;
  dVar63 = dVar76 + local_670 + dVar48;
  local_1f8._8_4_ = SUB84(dVar76,0);
  local_1f8._0_8_ = dVar63;
  local_1f8._12_4_ = (int)((ulong)dVar76 >> 0x20);
  dVar40 = local_658[6] * 449113.470201535;
  local_558[0x3d] = dVar45 + local_558[0x3d] + dVar57 + dVar24 + dVar47 + dVar40;
  auVar7._8_4_ = SUB84(local_658[5],0);
  auVar7._0_8_ = local_658[2];
  auVar7._12_4_ = uVar41;
  dVar34 = local_658[5] * -7.112730406981104e-05;
  local_558[0x17] = (local_558[0x17] + dVar42) - dVar34;
  dVar74 = local_658[7] * 6362141.693962547;
  local_558[0x23] = dVar46 + dVar46 + ((dVar68 + local_5e8 + local_558[0x23]) - dVar51) + dVar74;
  local_238 = local_658[2];
  uStack_230 = 0;
  dVar67 = local_658[2] * -7.112730406981104e-05;
  local_558[0x35] = (((local_768 - dVar64) + dVar53 + dVar21) - dVar60) - dVar67;
  local_1b8 = local_658[3];
  uStack_1b0 = 0;
  local_658[1] = local_658[1] * -4.470666408692084;
  dVar69 = local_658[3] * 6362141.693962547;
  local_558[0x47] = local_558[0x47] + dVar12 + local_658[1];
  local_558[1] = auVar5._8_8_;
  local_558[0] = dVar52 + dVar56;
  local_558[3] = (local_558[3] - dVar35) - dVar56;
  local_558[2] = dVar50 + local_558[2];
  local_558[6] = (local_558[6] - dVar35) + dVar56;
  local_558[7] = local_558[7] - dVar56;
  dVar52 = local_658[7] * 3347824.3674030215;
  local_178 = local_658[7];
  uStack_170 = 0;
  local_558[0x1e] = dVar49 + ((local_558[0x1e] - dVar68) - dVar51) + dVar52;
  local_558[0x21] = (((local_558[0x21] - dVar49) - dVar46) - dVar74) - dVar52;
  local_558[0x20] = dVar51 + local_558[0x20] + dVar74;
  local_558[0x24] = dVar52 + ((local_558[0x24] - dVar49) - dVar46);
  local_558[0x25] = (local_558[0x25] - dVar74) - dVar52;
  local_1a8._8_8_ = 0;
  local_1a8._0_8_ = local_5a8 + local_578;
  local_138 = dStack_570;
  uStack_130 = 0;
  local_148 = dStack_580;
  uStack_140 = 0;
  dVar52 = local_658[7] * 5672469.694980093;
  local_558[0x2c] = ((((dVar25 + local_558[0x2c]) - dVar78) - dVar44) - dVar58) - dVar52;
  local_558[0x2d] = dVar52 + dVar44 + dVar44 + dVar78 + dVar25 + local_558[0x2d] + dVar58;
  local_558[0x2e] = dVar52 + (local_558[0x2e] - dVar58);
  local_558[0x2f] = local_558[0x2f] - dVar52;
  dStack_160 = auVar18._8_8_;
  local_658[0] = local_658[0] * -4323.663734083463;
  dVar52 = dStack_160 * -5282.492258864639;
  local_1d0 = local_558[0x39] - dVar67;
  local_558[0x3c] = dVar45 + local_558[0x3c] + local_658[0];
  local_558[0x3f] = ((local_558[0x3f] - dVar45) - dVar54) - local_658[0];
  local_558[0x40] = (local_558[0x40] - dVar57) - dVar52;
  dVar44 = local_658[3] * 3347824.3674030215;
  dVar49 = local_658[4] * 5672469.694980093;
  local_558[0x46] = local_558[0x46] + dVar44;
  local_208 = local_658[4] * local_658[7] * 5672469.694980093 +
              local_658[6] * local_658[5] * -5282.492258864639;
  local_1c8 = local_658[4] * local_658[7] * 12599.866574880663 +
              (0.0022212311836643283 -
              ((local_578 + dStack_580) - (local_588 + dStack_570)) * 0.0006666666666666666) *
              -5282.492258864639 * local_658[6] * local_658[5];
  dStack_1c0 = local_658[4];
  local_228 = (dVar43 + dVar43 + dVar66 * 2.0 + ((dVar55 + dVar77 + (local_680 - dVar59)) - dVar38)
              + dStack_220) - dVar70;
  local_688 = local_688 - local_208;
  auVar8._8_4_ = SUB84((double)local_310._8_8_ - dVar49,0);
  auVar8._0_8_ = ((double)local_310._0_8_ - dVar69) - dVar44;
  auVar8._12_4_ = (int)((ulong)((double)local_310._8_8_ - dVar49) >> 0x20);
  local_310 = auVar8;
  local_288[4] = dVar73 - local_1c8;
  dVar78 = local_658[2] * -43.95116952269832;
  local_188 = (((dVar54 + dVar54 + local_558[0x41] + dVar57) - dVar24) + dVar52) - dVar78;
  local_1e0 = ((((((local_558[0x42] - dVar45) - dVar54) - dVar57) - dVar24) - (dVar47 + dVar47)) -
              (dVar40 + dVar40)) + local_658[0] + dVar52 + dVar78;
  local_1d8 = (((dVar40 + dVar47 + local_558[0x43]) - local_658[0]) - dVar52) - dVar78;
  dVar50 = local_658[7] * 1000000.0;
  dVar59 = local_658[5] * 1000000.0;
  dVar52 = local_658[6] * -5282.492258864639;
  dVar40 = local_658[7] * 23496864.50220335;
  dStack_190 = (((dVar60 + dVar60 + dVar22 + dVar22 + ((dVar53 + dVar64 + local_558[0x37]) - dVar21)
                 + dVar62) - dVar11) + dVar67 + dVar52) - dVar50;
  dVar56 = local_658[6] * -1032.714674988212;
  dVar51 = local_658[6] * -43.95116952269832;
  local_558[0x16] = ((local_558[0x16] + dVar42) - dVar14) + dVar15 + dVar34 + dVar51 + dVar56;
  local_558[0x19] =
       ((((dVar14 + dVar14 + (local_558[0x19] - dVar42)) - dVar15) + dVar34) - dVar51) - dVar56;
  local_558[0x1a] = dVar51 + (local_558[0x1a] - dVar15) + dVar56;
  local_558[0x1b] = ((local_558[0x1b] - dVar34) - dVar51) - dVar56;
  local_558[0x34] = ((local_558[0x34] + dVar21) - dVar22) + dVar11 + dVar67 + dVar50 + dVar40;
  local_558[0x36] = local_198 - dVar52;
  local_558[0x37] = dStack_190 - dVar40;
  local_558[0x38] = local_168 + dVar52 + dVar50 + dVar40;
  dVar51 = local_658[2] * -1032.714674988212;
  local_558[0x39] = (((local_558[0x39] - dVar67) - dVar52) - dVar50) - dVar40;
  local_558[0x3e] = local_558[0x3e] + dVar24 + dVar78 + dVar51;
  local_558[0x41] = local_188 - dVar51;
  local_558[0x42] = local_1e0 + dVar51;
  local_558[0x43] = local_1d8 - dVar51;
  dVar52 = local_658[5] * 23496864.50220335;
  local_558[0x48] = local_558[0x48] + dVar69 + dVar59 + dVar52;
  local_300 = ((local_300 + dVar69 + dVar49) - dVar59) - dVar52;
  local_2f8 = ((local_2f8 - (dVar12 + dVar12)) - (local_658[1] + local_658[1])) + dVar44 + dVar49 +
              dVar59 + dVar52;
  local_2f0 = (((((dVar12 + local_2f0 + local_658[1]) - dVar69) - dVar44) - dVar49) - dVar59) -
              dVar52;
  dStack_5b0 = auVar7._8_8_;
  local_658[6] = local_658[2] * local_658[6];
  dVar50 = local_658[5] * local_658[7] * 0.0 +
           (0.0 - ((local_578 + local_598) - (dStack_570 + dStack_580)) * 0.0006666666666666666) *
           -43.95116952269832 * local_658[6];
  dVar51 = (double)local_88._8_8_ * local_658[3] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((local_598 + dStack_580) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -7.112730406981104e-05 * dStack_5b0 * local_658[2];
  local_288[1] = dVar65 + dVar13 + dVar61 + dVar75;
  dVar59 = dVar51 + dVar75 + ((local_288[2] + dVar32 + dVar23) - dVar39);
  auVar9._8_4_ = SUB84(dVar59,0);
  auVar9._0_8_ = local_288[1];
  auVar9._12_4_ = (int)((ulong)dVar59 >> 0x20);
  dVar59 = local_658[5] * local_658[7] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((local_578 + local_598) - (dStack_580 + dStack_570)) * 0.0006666666666666666) *
           -1032.714674988212 * local_658[6];
  dVar52 = local_658[7] * local_658[3] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((local_5a8 + local_578) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -4323.663734083463 * local_158;
  local_288[0] = dVar37 + ((local_288[0] - dVar26) - dVar23) + dVar52;
  local_288[2] = auVar9._8_8_;
  dVar32 = local_658[5] * local_658[7] * 1000000.0 + local_658[6] * -43.95116952269832;
  dVar42 = (double)local_88._8_8_ * local_658[3] * 6362141.693962547 +
           dStack_5b0 * local_658[2] * -7.112730406981104e-05;
  local_6a8[1] = dVar36 + (local_6a8[1] - dVar77) + dStack_220 + dVar70 + dVar48 + dVar76;
  dVar44 = local_658[5] * local_658[7] * 23496864.50220335 + local_658[6] * -1032.714674988212;
  dVar49 = local_658[7] * local_658[3] * 3347824.3674030215 + local_158 * -4323.663734083463;
  local_6a8[0] = dVar36 + ((local_6a8[0] - dVar55) - dVar38) + dVar49;
  dVar40 = dVar70 + dVar72 + dVar42 + dVar32 + dVar44;
  local_698 = SUB84(dVar40,0);
  uStack_694 = (undefined4)((ulong)dVar40 >> 0x20);
  dStack_690 = (dVar33 - dVar42) - dVar49;
  local_680 = ((local_228 + dVar42 + local_208) - dVar32) - dVar44;
  dStack_678 = dVar76 * -2.0 +
               (((((dStack_678 - dVar36) - dVar43) - dStack_220) - dVar70) - (dVar48 + dVar48)) +
               dVar49 + local_208 + dVar32 + dVar44;
  local_670 = ((((dVar63 - dVar42) - dVar49) - local_208) - dVar32) - dVar44;
  local_288[2] = local_288[2] + dVar50 + dVar59;
  local_288[3] = ((((dVar23 + dStack_200 + dStack_710) - dVar37) - dVar10) - dVar51) - dVar52;
  local_288[5] = (((dVar71 - dVar75) + dVar51 + local_1c8) - dVar50) - dVar59;
  local_288[6] = local_218 + dVar52 + local_1c8 + dVar50 + dVar59;
  local_288[7] = (((((dVar65 + local_288[7] + dVar13) - dVar51) - dVar52) - local_1c8) - dVar50) -
                 dVar59;
  if (iVar29 == 0) {
    local_128[0] = 2.8916149455543745;
    local_128[1] = 3.3887808219431252;
    local_128[2] = 4.665255136408125;
    local_128[3] = 1.5;
    local_128[4] = 1.506900950283125;
    local_128[5] = 2.9628176357525002;
    local_128[6] = 5.2821630604062495;
    local_128[7] = 7.4795990834;
    local_128[8] = 3.1861205355625004;
    local_d8[0] = 0.00049010354654;
    local_d8[1] = 0.000340356715215;
    local_d8[2] = 0.0011616005819375;
    local_d8[3] = 0.0;
    local_d8[4] = -1.20361935e-05;
    local_d8[5] = 0.00046729736768999996;
    local_d8[6] = 0.0009643321552500001;
    local_d8[7] = 0.0013043066091500003;
    local_d8[8] = 0.00037292866150000014;
    pdVar27 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    local_128[0] = 3.8916149455543745;
    local_128[1] = 4.388780821943126;
    local_128[2] = 5.665255136408124;
    local_128[3] = 2.5;
    local_128[4] = 2.506900950283125;
    local_128[5] = 3.9628176357525002;
    local_128[6] = 6.28216306040625;
    local_128[7] = 8.4795990834;
    local_128[8] = 4.1861205355625;
    local_d8[0] = 0.00049010354654;
    local_d8[1] = 0.000340356715215;
    local_d8[2] = 0.0011616005819375;
    local_d8[3] = 0.0;
    local_d8[4] = -1.20361935e-05;
    local_d8[5] = 0.00046729736768999996;
    local_d8[6] = 0.0009643321552500001;
    local_d8[7] = 0.0013043066091500003;
    local_d8[8] = 0.00037292866150000014;
    pdVar27 = &local_5a8;
  }
  dVar63 = 0.0;
  dVar59 = 0.0;
  dVar40 = 0.0;
  dVar52 = 0.0;
  for (lVar31 = 0; lVar31 != 0x48; lVar31 = lVar31 + 8) {
    dVar40 = dVar40 + *(double *)((long)local_d8 + lVar31) * *(double *)((long)local_658 + lVar31);
    dVar33 = *(double *)((long)pdVar27 + lVar31);
    dVar63 = dVar63 + *(double *)((long)local_658 + lVar31) * *(double *)((long)local_128 + lVar31);
    dVar59 = dVar59 + *(double *)((long)local_6a8 + lVar31) * dVar33;
    dVar52 = dVar52 + (*(double *)((long)local_128 + lVar31) - dVar33) * 0.0006666666666666666 *
                      *(double *)((long)local_6a8 + lVar31) +
                      dVar33 * *(double *)((long)local_288 + lVar31);
  }
  dVar59 = dVar59 * (1.0 / dVar63);
  dVar33 = (1.0 / dVar63) * 1500.0;
  dVar63 = dVar59 * dVar33;
  dVar33 = -dVar33;
  for (lVar31 = 0; lVar31 != 9; lVar31 = lVar31 + 1) {
    dVar32 = 0.0;
    for (lVar30 = 0; lVar30 != 9; lVar30 = lVar30 + 1) {
      dVar32 = dVar32 + pdVar27[lVar30] * pdVar28[lVar30];
    }
    local_558[lVar31 * 10 + 9] = local_128[lVar31] * dVar63 + dVar32 * dVar33;
    pdVar28 = pdVar28 + 10;
  }
  pdVar28 = local_558;
  local_288[9] = dVar33 * dVar52 + (dVar63 * dVar40 - dVar59);
  iVar29 = 0;
  for (lVar31 = 0; lVar31 != 10; lVar31 = lVar31 + 1) {
    for (lVar30 = 0; lVar30 != 10; lVar30 = lVar30 + 1) {
      iVar29 = iVar29 + (uint)(pdVar28[lVar30] != 0.0);
    }
    pdVar28 = pdVar28 + 10;
  }
  *nJdata = iVar29 * NCELLS;
  return;
}

Assistant:

void
SPARSITY_INFO(int* nJdata, const int* consP, int NCELLS)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  int nJdata_tmp = 0;
  for (int k = 0; k < 10; k++) {
    for (int l = 0; l < 10; l++) {
      if (Jac[10 * k + l] != 0.0) {
        nJdata_tmp = nJdata_tmp + 1;
      }
    }
  }

  *nJdata = NCELLS * nJdata_tmp;
}